

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O3

bool edge_detection::DetectVerticalEdge<double>(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint32_t height;
  uint32_t x;
  uint8_t value;
  uint32_t uVar4;
  uint uVar5;
  undefined4 uVar6;
  pointer pPVar7;
  undefined4 uVar8;
  uint32_t *x_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [16];
  undefined1 in_XMM4 [16];
  uint32_t roiWidth;
  uint32_t roiY;
  undefined4 local_d0;
  undefined4 local_cc;
  uint32_t local_c8;
  uint local_c4;
  uint32_t roiHeight;
  uint32_t roiX;
  EdgeDetectionBase<double> edgeDetection;
  Image image;
  EdgeParameter local_50;
  
  uVar4 = Test_Helper::runCount();
  if (uVar4 == 0) {
    return true;
  }
  uVar5 = 0;
LAB_0013679b:
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&edgeDetection,0,0,'\x01','\x01');
  Unit_Test::blackImage(&image,(Image *)&edgeDetection);
  edgeDetection.positiveEdgePoint.
  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear
            ((ImageTemplate<unsigned_char> *)&edgeDetection);
  x_00 = &roiX;
  Unit_Test::generateRoi(&image,x_00,&roiY,&roiWidth,&roiHeight);
  x = roiX;
  height = roiHeight;
  uVar4 = roiY;
  auVar11 = in_ZMM1._0_16_;
  iVar1 = roiHeight + roiY;
  if (roiY < 2) {
    if (roiY != 0) {
      uVar8 = 0;
      goto LAB_00136818;
    }
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar8 = (undefined4)CONCAT71((int7)((ulong)x_00 >> 8),roiY + 1 < image._height);
LAB_00136818:
    uVar6 = CONCAT31((int3)(image._height >> 8),iVar1 + 2U < image._height);
  }
  local_c4 = uVar5;
  if (((char)uVar8 != '\0') || (bVar3 = false, (char)uVar6 != '\0')) {
    local_c8 = roiWidth;
    local_d0 = uVar6;
    local_cc = uVar8;
    uVar5 = rand();
    value = (uint8_t)uVar5;
    if ((uVar5 & 0xc0) == 0) {
      value = '@';
    }
    Unit_Test::fillImage(&image,x,uVar4,local_c8,height,value);
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_ZMM1 = ZEXT1664(auVar11);
    EdgeParameter::EdgeParameter(&local_50,TOP_TO_BOTTOM,ANY,ALL,1,1,0,0,'\n');
    EdgeDetectionBase<double>::find(&edgeDetection,&image,0,0,image._width,image._height,&local_50);
    if ((((char)local_cc == '\0') ||
        (bVar3 = true,
        (long)edgeDetection.positiveEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)edgeDetection.positiveEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 == (ulong)roiWidth)) &&
       (((char)local_d0 == '\0' ||
        (bVar3 = true,
        (long)edgeDetection.negativeEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)edgeDetection.negativeEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 == (ulong)roiWidth)))) {
      auVar11._8_8_ = 0x7fffffffffffffff;
      auVar11._0_8_ = 0x7fffffffffffffff;
      if (edgeDetection.positiveEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          edgeDetection.positiveEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,roiY);
        pPVar7 = edgeDetection.positiveEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pPVar7->y - auVar2._0_8_;
          auVar9 = vandpd_avx(auVar9,auVar11);
          in_ZMM1 = ZEXT1664(auVar9);
          if (1.0 < auVar9._0_8_) goto LAB_001369ba;
          pPVar7 = pPVar7 + 1;
        } while (pPVar7 != edgeDetection.positiveEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (edgeDetection.negativeEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          edgeDetection.negativeEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        auVar2 = vcvtusi2sd_avx512f(in_XMM4,iVar1);
        pPVar7 = edgeDetection.negativeEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pPVar7->y - auVar2._0_8_;
          auVar9 = vandpd_avx(auVar10,auVar11);
          in_ZMM1 = ZEXT1664(auVar9);
          if (1.0 < auVar9._0_8_) goto LAB_001369ba;
          pPVar7 = pPVar7 + 1;
        } while (pPVar7 != edgeDetection.negativeEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        bVar3 = false;
      }
    }
    goto LAB_001369c4;
  }
  goto LAB_001369dd;
LAB_001369ba:
  bVar3 = true;
LAB_001369c4:
  if (edgeDetection.negativeEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edgeDetection.negativeEdgePoint.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edgeDetection.positiveEdgePoint.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001369dd:
  image._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&image);
  if (bVar3) {
    return false;
  }
  uVar5 = local_c4 + 1;
  uVar4 = Test_Helper::runCount();
  if (uVar4 <= uVar5) {
    return true;
  }
  goto LAB_0013679b;
}

Assistant:

bool DetectVerticalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiYEnd = roiY + roiHeight;
            const bool isValidTopEdge    = ( roiY > 1u ) && ( roiY    + 1u < image.height() );
            const bool isValidBottomEdge = ( roiY > 0u ) && ( roiYEnd + 2u < image.height() );

            if ( !isValidTopEdge && !isValidBottomEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::TOP_TO_BOTTOM) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidTopEdge && (positive.size() != roiWidth) ) || ( isValidBottomEdge && (negative.size() != roiWidth) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->y - roiY ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->y - roiYEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }